

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O1

LIndex __thiscall
PlanningUnitMADPDiscrete::GetNrPolicies(PlanningUnitMADPDiscrete *this,Index agentI)

{
  int iVar1;
  size_t sVar2;
  undefined4 extraout_var;
  size_t sVar3;
  EOverflow *this_00;
  LIndex LVar4;
  LIndex LVar5;
  
  sVar2 = GetNrObservationHistories(this,agentI);
  LVar4 = 1;
  if (sVar2 != 0) {
    sVar2 = 0;
    LVar5 = LVar4;
    do {
      iVar1 = (*(this->super_PlanningUnit)._vptr_PlanningUnit[7])(this,agentI);
      LVar4 = CONCAT44(extraout_var,iVar1) * LVar5;
      if (LVar4 < LVar5) {
        this_00 = (EOverflow *)__cxa_allocate_exception(0x28);
        EOverflow::EOverflow(this_00,"PlanningUnitMADPDiscrete::GetNrPolicies() overflow detected");
        __cxa_throw(this_00,&EOverflow::typeinfo,E::~E);
      }
      sVar2 = sVar2 + 1;
      sVar3 = GetNrObservationHistories(this,agentI);
      LVar5 = LVar4;
    } while (sVar2 != sVar3);
  }
  return LVar4;
}

Assistant:

LIndex PlanningUnitMADPDiscrete::GetNrPolicies(Index agentI) const
{
#if 0 // don't use powl(), we want to detect overflow
    return( static_cast<LIndex>(powl( GetNrActions(agentI), 
                                      GetNrObservationHistories(agentI))));
#endif
    LIndex nrPols=1;
    for(size_t k=0;k!=GetNrObservationHistories(agentI);++k)
    {
        LIndex nrPolsOld=nrPols;
        nrPols*=GetNrActions(agentI);
        if(nrPols<nrPolsOld)
            throw(EOverflow("PlanningUnitMADPDiscrete::GetNrPolicies() overflow detected"));
    }
    return(nrPols);
}